

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.h
# Opt level: O0

void __thiscall Lowerer::Lowerer(Lowerer *this,Func *func)

{
  Func *func_local;
  Lowerer *this_local;
  
  this->m_func = func;
  LowererMD::LowererMD(&this->m_lowererMD,func);
  this->nextStackFunctionOpnd = (Opnd *)0x0;
  this->outerMostLoopLabel = (LabelInstr *)0x0;
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->addToLiveOnBackEdgeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->currentRegion = (Region *)0x0;
  LowerGeneratorHelper::LowerGeneratorHelper
            (&this->m_lowerGeneratorHelper,func,this,&this->m_lowererMD);
  this->m_func->m_lowerer = this;
  this->helperCallCheckState = HelperCallCheckState_None;
  this->oldHelperCallCheckState = HelperCallCheckState_None;
  return;
}

Assistant:

Lowerer(Func * func) : m_func(func), m_lowererMD(func), nextStackFunctionOpnd(nullptr), outerMostLoopLabel(nullptr),
        initializedTempSym(nullptr), addToLiveOnBackEdgeSyms(nullptr), currentRegion(nullptr),
        m_lowerGeneratorHelper(LowerGeneratorHelper(func, this, this->m_lowererMD))
    {
#ifdef RECYCLER_WRITE_BARRIER_JIT
        m_func->m_lowerer = this;
#endif
#if DBG
        this->helperCallCheckState = HelperCallCheckState_None;
        this->oldHelperCallCheckState = HelperCallCheckState_None;
#endif
        
    }